

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  u8 uVar1;
  i16 iVar2;
  long lVar3;
  VtabCtx *pVVar4;
  Table *pTVar5;
  Table *pTab;
  int iVar6;
  uchar *z;
  Index *pIVar7;
  char *zFormat;
  uint rc;
  long lVar8;
  long in_FS_OFFSET;
  int tokenType;
  Parse sParse;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&sParse,0xaa,0x1a8);
  lVar8 = 0;
  z = (uchar *)zCreateTable;
  do {
    if (lVar8 == 2) {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      pVVar4 = db->pVtabCtx;
      if ((pVVar4 == (VtabCtx *)0x0) || (pVVar4->bDeclared != 0)) {
        iVar6 = sqlite3MisuseError(0x266ae);
        sqlite3Error(db,iVar6);
        if (db->mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          iVar6 = sqlite3MisuseError(0x266b0);
          return iVar6;
        }
      }
      else {
        pTVar5 = pVVar4->pTab;
        sqlite3ParseObjectInit(&sParse,db);
        sParse.eParseMode = '\x01';
        sParse.disableTriggers = '\x01';
        uVar1 = (db->init).busy;
        (db->init).busy = '\0';
        sParse.nQueryLoop = 1;
        iVar6 = sqlite3RunParser(&sParse,zCreateTable);
        pTab = sParse.pNewTable;
        if (iVar6 == 0) {
          rc = 0;
          if (pTVar5->aCol == (Column *)0x0) {
            pTVar5->aCol = (sParse.pNewTable)->aCol;
            sqlite3ExprListDelete(db,((sParse.pNewTable)->u).tab.pDfltList);
            iVar2 = pTab->nCol;
            pTVar5->nCol = iVar2;
            pTVar5->nNVCol = iVar2;
            pTVar5->tabFlags = pTVar5->tabFlags | pTab->tabFlags & 0x280;
            pTab->nCol = 0;
            pTab->aCol = (Column *)0x0;
            rc = 0;
            if (((pTab->tabFlags & 0x80) != 0) &&
               (pVVar4->pVTable->pMod->pModule->xUpdate !=
                (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)) {
              pIVar7 = sqlite3PrimaryKeyIndex(pTab);
              rc = (uint)(pIVar7->nKeyCol != 1);
            }
            pIVar7 = pTab->pIndex;
            if (pIVar7 != (Index *)0x0) {
              pTVar5->pIndex = pIVar7;
              pTab->pIndex = (Index *)0x0;
              pIVar7->pTable = pTVar5;
            }
          }
          pVVar4->bDeclared = 1;
        }
        else {
          zFormat = "%s";
          if (sParse.zErrMsg == (char *)0x0) {
            zFormat = (char *)0x0;
          }
          rc = 1;
          sqlite3ErrorWithMsg(db,1,zFormat);
          sqlite3DbFree(db,sParse.zErrMsg);
        }
        sParse.eParseMode = '\0';
        if (sParse.pVdbe != (Vdbe *)0x0) {
          sqlite3VdbeFinalize(sParse.pVdbe);
        }
        sqlite3DeleteTable(db,sParse.pNewTable);
        sqlite3ParseObjectReset(&sParse);
        (db->init).busy = uVar1;
        iVar6 = sqlite3ApiExit(db,rc);
        if (db->mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        }
LAB_00127f32:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          return iVar6;
        }
      }
      __stack_chk_fail();
    }
    tokenType = 0;
    do {
      iVar6 = sqlite3GetToken(z,&tokenType);
      z = z + iVar6;
    } while ((tokenType & 0xfffffffeU) == 0xb8);
    if (tokenType != (uint)"\x11\x10"[lVar8]) {
      iVar6 = 1;
      sqlite3ErrorWithMsg(db,1,"syntax error");
      goto LAB_00127f32;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  int rc = SQLITE_OK;
  Table *pTab;
  Parse sParse;
  int initBusy;
  int i;
  const unsigned char *z;
  static const u8 aKeyword[] = { TK_CREATE, TK_TABLE, 0 };

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Verify that the first two keywords in the CREATE TABLE statement
  ** really are "CREATE" and "TABLE".  If this is not the case, then
  ** sqlite3_declare_vtab() is being misused.
  */
  z = (const unsigned char*)zCreateTable;
  for(i=0; aKeyword[i]; i++){
    int tokenType = 0;
    do{
      z += sqlite3GetToken(z, &tokenType);
    }while( tokenType==TK_SPACE || tokenType==TK_COMMENT );
    if( tokenType!=aKeyword[i] ){
      sqlite3ErrorWithMsg(db, SQLITE_ERROR, "syntax error");
      return SQLITE_ERROR;
    }
  }

  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE_BKPT);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }

  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  sqlite3ParseObjectInit(&sParse, db);
  sParse.eParseMode = PARSE_MODE_DECLARE_VTAB;
  sParse.disableTriggers = 1;
  /* We should never be able to reach this point while loading the
  ** schema.  Nevertheless, defend against that (turn off db->init.busy)
  ** in case a bug arises. */
  assert( db->init.busy==0 );
  initBusy = db->init.busy;
  db->init.busy = 0;
  sParse.nQueryLoop = 1;
  if( SQLITE_OK==sqlite3RunParser(&sParse, zCreateTable) ){
    assert( sParse.pNewTable!=0 );
    assert( !db->mallocFailed );
    assert( IsOrdinaryTable(sParse.pNewTable) );
    assert( sParse.zErrMsg==0 );
    if( !pTab->aCol ){
      Table *pNew = sParse.pNewTable;
      Index *pIdx;
      pTab->aCol = pNew->aCol;
      assert( IsOrdinaryTable(pNew) );
      sqlite3ExprListDelete(db, pNew->u.tab.pDfltList);
      pTab->nNVCol = pTab->nCol = pNew->nCol;
      pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
      pNew->nCol = 0;
      pNew->aCol = 0;
      assert( pTab->pIndex==0 );
      assert( HasRowid(pNew) || sqlite3PrimaryKeyIndex(pNew)!=0 );
      if( !HasRowid(pNew)
       && pCtx->pVTable->pMod->pModule->xUpdate!=0
       && sqlite3PrimaryKeyIndex(pNew)->nKeyCol!=1
      ){
        /* WITHOUT ROWID virtual tables must either be read-only (xUpdate==0)
        ** or else must have a single-column PRIMARY KEY */
        rc = SQLITE_ERROR;
      }
      pIdx = pNew->pIndex;
      if( pIdx ){
        assert( pIdx->pNext==0 );
        pTab->pIndex = pIdx;
        pNew->pIndex = 0;
        pIdx->pTable = pTab;
      }
    }
    pCtx->bDeclared = 1;
  }else{
    sqlite3ErrorWithMsg(db, SQLITE_ERROR,
          (sParse.zErrMsg ? "%s" : 0), sParse.zErrMsg);
    sqlite3DbFree(db, sParse.zErrMsg);
    rc = SQLITE_ERROR;
  }
  sParse.eParseMode = PARSE_MODE_NORMAL;

  if( sParse.pVdbe ){
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  sqlite3DeleteTable(db, sParse.pNewTable);
  sqlite3ParseObjectReset(&sParse);
  db->init.busy = initBusy;

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}